

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

uint __thiscall Assimp::XGLImporter::ReadIndexFromText(XGLImporter *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar2 = SkipToText(this);
  if (bVar2) {
    iVar3 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    pbVar5 = (byte *)CONCAT44(extraout_var,iVar3);
    do {
      pbVar4 = pbVar5 + 1;
      bVar1 = *pbVar5;
      uVar7 = (ulong)bVar1;
      if (0x20 < uVar7) goto LAB_005a5350;
      pbVar5 = pbVar4;
    } while ((0x100000200U >> (uVar7 & 0x3f) & 1) != 0);
    if ((0x3401UL >> (uVar7 & 0x3f) & 1) == 0) {
LAB_005a5350:
      if (0xf5 < (byte)(bVar1 - 0x3a)) {
        uVar6 = 0;
        do {
          uVar6 = (uint)(byte)((char)uVar7 - 0x30) + uVar6 * 10;
          bVar1 = *pbVar4;
          uVar7 = (ulong)bVar1;
          pbVar4 = pbVar4 + 1;
        } while (0xf5 < (byte)(bVar1 - 0x3a));
        return uVar6;
      }
    }
  }
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5a5347);
  return 0xffffffff;
}

Assistant:

unsigned int XGLImporter::ReadIndexFromText()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading index element contents");
        return ~0u;
    }
    const char* s = m_reader->getNodeData(), *se;
    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse index element");
        return ~0u;
    }

    const unsigned int t = strtoul10(s,&se);

    if (se == s) {
        LogError("failed to read index");
        return ~0u;
    }

    return t;
}